

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  pointer pRVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  pointer pRVar6;
  int iVar7;
  ostream *os_00;
  int iVar8;
  ofstream fout;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  uVar3 = _vtable;
  pp_Var2 = _VTT;
  pRVar6 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar6 == pRVar1) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    iVar7 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)&this->CurrentArgument);
      std::ofstream::ofstream((ostream *)local_230);
      if ((pRVar6->Filename)._M_string_length == 0) {
        iVar8 = iVar7 + 1;
        bVar4 = 0 < iVar7;
        os_00 = os;
        iVar7 = iVar8;
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
        }
      }
      else {
        std::ofstream::open((char *)local_230,(_Ios_Openmode)(pRVar6->Filename)._M_dataplus._M_p);
        os_00 = (ostream *)local_230;
      }
      bVar4 = PrintDocumentation(this,pRVar6->HelpType,os_00);
      if ((!bVar4) || (((&os_00->field_0x20)[(long)os_00->_vptr_basic_ostream[-3]] & 5) != 0)) {
        bVar5 = false;
      }
      local_230._0_8_ = pp_Var2;
      *(undefined8 *)(local_230 + (long)pp_Var2[-3]) = uVar3;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  return bVar5;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (RequestedHelpItem const& rhi : this->RequestedHelpItems) {
    this->CurrentArgument = rhi.Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!rhi.Filename.empty()) {
      fout.open(rhi.Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(rhi.HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}